

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::optimizeTernary<wasm::If>(OptimizeInstructions *this,If *curr)

{
  Builder BVar1;
  bool bVar2;
  bool bVar3;
  Module *wasm;
  Expression *pEVar4;
  size_t sVar5;
  Expression **ppEVar6;
  Iterator IVar7;
  bool local_26d;
  AbstractChildIterator<wasm::ChildIterator> local_258;
  Iterator local_218;
  Self *local_208;
  Index local_200;
  AbstractChildIterator<wasm::ChildIterator> local_1f8;
  Iterator local_1b8;
  Expression *local_1a8;
  Expression *reuse;
  BasicType local_198;
  bool validChildren;
  BasicType BStack_194;
  bool validEffects;
  _Head_base<0UL,_wasm::Function_*,_false> local_190;
  Type newOuterType;
  bool validTypes;
  Iterator local_170;
  Expression *local_160;
  Expression *ifFalseChild;
  Index local_150;
  Iterator local_148;
  Expression *local_138;
  Expression *ifTrueChild;
  ChildIterator ifFalseChildren;
  ChildIterator ifTrueChildren;
  undefined1 local_a0 [8];
  SmallVector<wasm::Expression_*,_1UL> chain;
  undefined1 local_70 [8];
  anon_class_24_3_af057605 updateArm;
  Type newType;
  anon_class_16_2_7fa2728d check;
  Const *c;
  Unary *un;
  BasicType local_28 [2];
  Builder local_20;
  Builder builder;
  If *curr_local;
  OptimizeInstructions *this_local;
  
  builder.wasm = (Module *)curr;
  wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
         getModule(&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                    ).
                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .
                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  );
  Builder::Builder(&local_20,wasm);
  local_28[1] = 1;
  bVar2 = wasm::Type::operator!=
                    ((Type *)&((builder.wasm)->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,local_28 + 1);
  local_26d = false;
  if (bVar2) {
    local_28[0] = unreachable;
    bVar2 = wasm::Type::operator!=
                      ((Type *)(((builder.wasm)->functions).
                                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1),local_28);
    local_26d = false;
    if (bVar2) {
      un._4_4_ = 1;
      local_26d = wasm::Type::operator!=
                            ((Type *)(((builder.wasm)->functions).
                                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + 1),
                             (BasicType *)((long)&un + 4));
    }
  }
  if (local_26d != false) {
    newType.id = (uintptr_t)&check.un;
    check.c = &c;
    bVar2 = optimizeTernary<wasm::If>::anon_class_16_2_7fa2728d::operator()
                      ((anon_class_16_2_7fa2728d *)&newType,
                       (Expression *)
                       ((builder.wasm)->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (Expression *)
                       ((builder.wasm)->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if ((bVar2) ||
       (bVar2 = optimizeTernary<wasm::If>::anon_class_16_2_7fa2728d::operator()
                          ((anon_class_16_2_7fa2728d *)&newType,
                           (Expression *)
                           ((builder.wasm)->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (Expression *)
                           ((builder.wasm)->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start), bVar2)) {
      updateArm.newType =
           *(Type **)&((c->value).field_0.gcData.
                       super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_M_use_count;
      local_70 = (undefined1  [8])&c;
      updateArm.un = (Unary **)&check.un;
      updateArm.c = (Const **)&updateArm.newType;
      pEVar4 = optimizeTernary<wasm::If>::anon_class_24_3_af057605::operator()
                         ((anon_class_24_3_af057605 *)local_70,
                          (Expression *)
                          ((builder.wasm)->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      ((builder.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pEVar4;
      pEVar4 = optimizeTernary<wasm::If>::anon_class_24_3_af057605::operator()
                         ((anon_class_24_3_af057605 *)local_70,
                          (Expression *)
                          ((builder.wasm)->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      ((builder.wasm)->functions).
      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pEVar4;
      (c->value).field_0.func.super_IString.str._M_str = (char *)builder.wasm;
      chain.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)updateArm.newType;
      If::finalize((If *)builder.wasm,(Type)updateArm.newType);
      replaceCurrent(this,(Expression *)c);
      return;
    }
  }
  SmallVector<wasm::Expression_*,_1UL>::SmallVector
            ((SmallVector<wasm::Expression_*,_1UL> *)local_a0);
  do {
    bVar2 = Properties::isControlFlowStructure
                      ((Expression *)
                       ((builder.wasm)->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if ((bVar2) ||
       (bVar2 = ExpressionAnalyzer::shallowEqual
                          ((Expression *)
                           ((builder.wasm)->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (Expression *)
                           ((builder.wasm)->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish), !bVar2)) break;
    ChildIterator::ChildIterator
              ((ChildIterator *)
               ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                       flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data + 0x10),
               (Expression *)
               ((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    sVar5 = SmallVector<wasm::Expression_**,_4UL>::size
                      ((SmallVector<wasm::Expression_**,_4UL> *)
                       ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                               children.flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data + 0x10));
    if (sVar5 == 1) {
      ChildIterator::ChildIterator
                ((ChildIterator *)&ifTrueChild,
                 (Expression *)
                 ((builder.wasm)->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      IVar7 = AbstractChildIterator<wasm::ChildIterator>::begin
                        ((AbstractChildIterator<wasm::ChildIterator> *)
                         ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.
                                 children.flexible.
                                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                 ._M_impl.super__Vector_impl_data + 0x10));
      ifFalseChild = (Expression *)IVar7.parent;
      local_150 = IVar7.index;
      local_148.parent = (Self *)ifFalseChild;
      local_148.index = local_150;
      ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_148);
      local_138 = *ppEVar6;
      IVar7 = AbstractChildIterator<wasm::ChildIterator>::begin
                        ((AbstractChildIterator<wasm::ChildIterator> *)&ifTrueChild);
      local_170.parent = IVar7.parent;
      local_170.index = IVar7.index;
      ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_170);
      local_160 = *ppEVar6;
      newOuterType.id._7_1_ = wasm::Type::operator==(&local_138->type,&local_160->type);
      bVar2 = wasm::Type::operator==
                        ((Type *)(((builder.wasm)->functions).
                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1),
                         (Type *)(((builder.wasm)->functions).
                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 1));
      if (!bVar2) {
        __assert_fail("curr->ifTrue->type == curr->ifFalse->type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                      ,0x1430,"void wasm::OptimizeInstructions::optimizeTernary(T *) [T = wasm::If]"
                     );
      }
      local_190._M_head_impl =
           *(Function **)
            &((builder.wasm)->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t;
      BStack_194 = unreachable;
      bVar2 = wasm::Type::operator==((Type *)&local_190,&stack0xfffffffffffffe6c);
      local_198 = unreachable;
      bVar3 = wasm::Type::operator==
                        ((Type *)&((builder.wasm)->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,&local_198);
      if (bVar2 != bVar3) {
        newOuterType.id._7_1_ = 0;
      }
      reuse._7_1_ = 1;
      reuse._6_1_ = 1;
      if ((newOuterType.id._7_1_ & 1) == 0) {
        bVar2 = false;
      }
      else {
        ((builder.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_138;
        local_1a8 = (Expression *)
                    ((builder.wasm)->functions).
                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        ((builder.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_160;
        If::finalize((If *)builder.wasm);
        BVar1 = builder;
        ChildIterator::ChildIterator((ChildIterator *)&local_1f8,local_1a8);
        IVar7 = AbstractChildIterator<wasm::ChildIterator>::begin(&local_1f8);
        local_208 = IVar7.parent;
        local_200 = IVar7.index;
        local_1b8.parent = local_208;
        local_1b8.index = local_200;
        ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_1b8);
        *ppEVar6 = (Expression *)BVar1.wasm;
        ChildIterator::~ChildIterator((ChildIterator *)&local_1f8);
        bVar2 = SmallVector<wasm::Expression_*,_1UL>::empty
                          ((SmallVector<wasm::Expression_*,_1UL> *)local_a0);
        pEVar4 = local_1a8;
        if (!bVar2) {
          ppEVar6 = SmallVector<wasm::Expression_*,_1UL>::back
                              ((SmallVector<wasm::Expression_*,_1UL> *)local_a0);
          ChildIterator::ChildIterator((ChildIterator *)&local_258,*ppEVar6);
          IVar7 = AbstractChildIterator<wasm::ChildIterator>::begin(&local_258);
          local_218.parent = IVar7.parent;
          local_218.index = IVar7.index;
          ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_218);
          *ppEVar6 = pEVar4;
          ChildIterator::~ChildIterator((ChildIterator *)&local_258);
        }
        SmallVector<wasm::Expression_*,_1UL>::push_back
                  ((SmallVector<wasm::Expression_*,_1UL> *)local_a0,&local_1a8);
        bVar2 = true;
      }
      ChildIterator::~ChildIterator((ChildIterator *)&ifTrueChild);
      if (!bVar2) goto LAB_018d69b9;
    }
    else {
LAB_018d69b9:
      bVar2 = false;
    }
    ChildIterator::~ChildIterator
              ((ChildIterator *)
               ((long)&ifFalseChildren.super_AbstractChildIterator<wasm::ChildIterator>.children.
                       flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data + 0x10));
  } while (bVar2);
  bVar2 = SmallVector<wasm::Expression_*,_1UL>::empty
                    ((SmallVector<wasm::Expression_*,_1UL> *)local_a0);
  if (!bVar2) {
    ppEVar6 = SmallVector<wasm::Expression_*,_1UL>::operator[]
                        ((SmallVector<wasm::Expression_*,_1UL> *)local_a0,0);
    replaceCurrent(this,*ppEVar6);
  }
  SmallVector<wasm::Expression_*,_1UL>::~SmallVector
            ((SmallVector<wasm::Expression_*,_1UL> *)local_a0);
  return;
}

Assistant:

void optimizeTernary(T* curr) {
    using namespace Abstract;
    using namespace Match;
    Builder builder(*getModule());

    // If one arm is an operation and the other is an appropriate constant, we
    // can move the operation outside (where it may be further optimized), e.g.
    //
    //  (select
    //    (i32.eqz (X))
    //    (i32.const 0|1)
    //    (Y)
    //  )
    // =>
    //  (i32.eqz
    //    (select
    //      (X)
    //      (i32.const 1|0)
    //      (Y)
    //    )
    //  )
    //
    // Ignore unreachable code here; leave that for DCE.
    if (curr->type != Type::unreachable &&
        curr->ifTrue->type != Type::unreachable &&
        curr->ifFalse->type != Type::unreachable) {
      Unary* un;
      Const* c;
      auto check = [&](Expression* a, Expression* b) {
        return matches(b, bval(&c)) && matches(a, unary(&un, EqZ, any()));
      };
      if (check(curr->ifTrue, curr->ifFalse) ||
          check(curr->ifFalse, curr->ifTrue)) {
        // The new type of curr will be that of the value of the unary, as after
        // we move the unary out, its value is curr's direct child.
        auto newType = un->value->type;
        auto updateArm = [&](Expression* arm) -> Expression* {
          if (arm == un) {
            // This is the arm that had the eqz, which we need to remove.
            return un->value;
          } else {
            // This is the arm with the constant, which we need to flip.
            // Note that we also need to set the type to match the other arm.
            c->value =
              Literal::makeFromInt32(1 - c->value.getInteger(), newType);
            c->type = newType;
            return c;
          }
        };
        curr->ifTrue = updateArm(curr->ifTrue);
        curr->ifFalse = updateArm(curr->ifFalse);
        un->value = curr;
        curr->finalize(newType);
        return replaceCurrent(un);
      }
    }

    {
      // Identical code on both arms can be folded out, e.g.
      //
      //  (select
      //    (i32.eqz (X))
      //    (i32.eqz (Y))
      //    (Z)
      //  )
      // =>
      //  (i32.eqz
      //    (select
      //      (X)
      //      (Y)
      //      (Z)
      //    )
      //  )
      //
      // Continue doing this while we can, noting the chain of moved expressions
      // as we go, then do a single replaceCurrent() at the end.
      SmallVector<Expression*, 1> chain;
      while (1) {
        // Ignore control flow structures (which are handled in MergeBlocks).
        if (!Properties::isControlFlowStructure(curr->ifTrue) &&
            ExpressionAnalyzer::shallowEqual(curr->ifTrue, curr->ifFalse)) {
          // TODO: consider the case with more than one child.
          ChildIterator ifTrueChildren(curr->ifTrue);
          if (ifTrueChildren.children.size() == 1) {
            // ifTrue and ifFalse's children will become the direct children of
            // curr, and so they must be compatible to allow for a proper new
            // type after the transformation.
            //
            // At minimum an LUB is required, as shown here:
            //
            //  (if
            //    (condition)
            //    (drop (i32.const 1))
            //    (drop (f64.const 2.0))
            //  )
            //
            // However, that may not be enough, as with nominal types we can
            // have things like this:
            //
            //  (if
            //    (condition)
            //    (struct.get $A 1 (..))
            //    (struct.get $B 1 (..))
            //  )
            //
            // It is possible that the LUB of $A and $B does not contain field
            // "1". With structural types this specific problem is not possible,
            // and it appears to be the case that with the GC MVP there is no
            // instruction that poses a problem, but in principle it can happen
            // there as well, if we add an instruction that returns the number
            // of fields in a type, for example. For that reason, and to avoid
            // a difference between structural and nominal typing here, disallow
            // subtyping in both. (Note: In that example, the problem only
            // happens because the type is not part of the struct.get - we infer
            // it from the reference. That is why after hoisting the struct.get
            // out, and computing a new type for the if that is now the child of
            // the single struct.get, we get a struct.get of a supertype. So in
            // principle we could fix this by modifying the IR as well, but the
            // problem is more general, so avoid that.)
            ChildIterator ifFalseChildren(curr->ifFalse);
            auto* ifTrueChild = *ifTrueChildren.begin();
            auto* ifFalseChild = *ifFalseChildren.begin();
            bool validTypes = ifTrueChild->type == ifFalseChild->type;

            // In addition, after we move code outside of curr then we need to
            // not change unreachability - if we did, we'd need to propagate
            // that further, and we leave such work to DCE and Vacuum anyhow.
            // This can happen in something like this for example, where the
            // outer type changes from i32 to unreachable if we move the
            // returns outside:
            //
            //  (if (result i32)
            //    (local.get $x)
            //    (return
            //      (local.get $y)
            //    )
            //    (return
            //      (local.get $z)
            //    )
            //  )
            assert(curr->ifTrue->type == curr->ifFalse->type);
            auto newOuterType = curr->ifTrue->type;
            if ((newOuterType == Type::unreachable) !=
                (curr->type == Type::unreachable)) {
              validTypes = false;
            }

            // If the expression we are about to move outside has side effects,
            // then we cannot do so in general with a select: we'd be reducing
            // the amount of the effects as well as moving them. For an if,
            // the side effects execute once, so there is no problem.
            // TODO: handle certain side effects when possible in select
            bool validEffects = std::is_same<T, If>::value ||
                                !ShallowEffectAnalyzer(
                                   getPassOptions(), *getModule(), curr->ifTrue)
                                   .hasSideEffects();

            // In addition, check for specific limitations of select.
            bool validChildren =
              !std::is_same<T, Select>::value ||
              Properties::canEmitSelectWithArms(ifTrueChild, ifFalseChild);

            if (validTypes && validEffects && validChildren) {
              // Replace ifTrue with its child.
              curr->ifTrue = ifTrueChild;
              // Relace ifFalse with its child, and reuse that node outside.
              auto* reuse = curr->ifFalse;
              curr->ifFalse = ifFalseChild;
              // curr's type may have changed, if the instructions we moved out
              // had different input types than output types.
              curr->finalize();
              // Point to curr from the code that is now outside of it.
              *ChildIterator(reuse).begin() = curr;
              if (!chain.empty()) {
                // We've already moved things out, so chain them to there. That
                // is, the end of the chain should now point to reuse (which
                // in turn already points to curr).
                *ChildIterator(chain.back()).begin() = reuse;
              }
              chain.push_back(reuse);
              continue;
            }
          }
        }
        break;
      }
      if (!chain.empty()) {
        // The beginning of the chain is the new top parent.
        return replaceCurrent(chain[0]);
      }
    }
  }